

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_4> *
tcu::operator*(Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_4> *a,
              Matrix<float,_4,_4> *b)

{
  int row_1;
  long lVar1;
  Matrix<float,_4,_4> *res;
  float *pfVar2;
  int row;
  long lVar3;
  Vector<float,_4> *pVVar4;
  long lVar5;
  float v;
  float fVar6;
  undefined4 uVar7;
  
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[3].m_data[2] = 0.0;
  pVVar4[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[2].m_data[2] = 0.0;
  pVVar4[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[1].m_data[2] = 0.0;
  pVVar4[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar1 = 0;
  lVar3 = 0;
  pfVar2 = (float *)__return_storage_ptr__;
  do {
    lVar5 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar1 != lVar5) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar5) = uVar7;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar3 != 4);
  lVar1 = 0;
  do {
    lVar3 = 0;
    pVVar4 = (Vector<float,_4> *)b;
    do {
      fVar6 = 0.0;
      lVar5 = 0;
      do {
        fVar6 = fVar6 + *(float *)((long)a + lVar5 * 4) *
                        *(float *)((long)((Vector<tcu::Vector<float,_4>,_4> *)pVVar4->m_data)->
                                         m_data[0].m_data + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      (__return_storage_ptr__->m_data).m_data[lVar3].m_data[lVar1] = fVar6;
      lVar3 = lVar3 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    a = (Matrix<float,_4,_4> *)((long)a + 4);
  } while (lVar1 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}